

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::ConvolutionParameter::ConvolutionParameter
          (ConvolutionParameter *this,ConvolutionParameter *from)

{
  void *pvVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  int iVar8;
  bool bVar9;
  undefined3 uVar10;
  int32 iVar11;
  bool bVar12;
  undefined3 uVar13;
  uint32 uVar14;
  uint uVar15;
  FillerParameter *pFVar16;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ConvolutionParameter_007603d0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->pad_,&from->pad_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField
            (&this->kernel_size_,&from->kernel_size_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->stride_,&from->stride_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->dilation_,&from->dilation_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar15 = (from->_has_bits_).has_bits_[0];
  if ((uVar15 & 1) == 0) {
    this->weight_filler_ = (FillerParameter *)0x0;
  }
  else {
    pFVar16 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar16,from->weight_filler_);
    this->weight_filler_ = pFVar16;
    uVar15 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar15 & 2) == 0) {
    pFVar16 = (FillerParameter *)0x0;
  }
  else {
    pFVar16 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar16,from->bias_filler_);
  }
  this->bias_filler_ = pFVar16;
  uVar2 = from->pad_h_;
  uVar3 = from->pad_w_;
  uVar4 = from->kernel_h_;
  uVar5 = from->kernel_w_;
  uVar6 = from->stride_h_;
  uVar7 = from->stride_w_;
  iVar8 = from->engine_;
  bVar9 = from->force_nd_im2col_;
  uVar10 = *(undefined3 *)&from->field_0x89;
  iVar11 = from->axis_;
  bVar12 = from->bias_term_;
  uVar13 = *(undefined3 *)&from->field_0x91;
  uVar14 = from->group_;
  this->num_output_ = from->num_output_;
  this->pad_h_ = uVar2;
  this->pad_w_ = uVar3;
  this->kernel_h_ = uVar4;
  this->kernel_w_ = uVar5;
  this->stride_h_ = uVar6;
  this->stride_w_ = uVar7;
  this->engine_ = iVar8;
  this->force_nd_im2col_ = bVar9;
  *(undefined3 *)&this->field_0x89 = uVar10;
  this->axis_ = iVar11;
  this->bias_term_ = bVar12;
  *(undefined3 *)&this->field_0x91 = uVar13;
  this->group_ = uVar14;
  return;
}

Assistant:

ConvolutionParameter::ConvolutionParameter(const ConvolutionParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      pad_(from.pad_),
      kernel_size_(from.kernel_size_),
      stride_(from.stride_),
      dilation_(from.dilation_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weight_filler()) {
    weight_filler_ = new ::caffe::FillerParameter(*from.weight_filler_);
  } else {
    weight_filler_ = NULL;
  }
  if (from.has_bias_filler()) {
    bias_filler_ = new ::caffe::FillerParameter(*from.bias_filler_);
  } else {
    bias_filler_ = NULL;
  }
  ::memcpy(&num_output_, &from.num_output_,
    reinterpret_cast<char*>(&group_) -
    reinterpret_cast<char*>(&num_output_) + sizeof(group_));
  // @@protoc_insertion_point(copy_constructor:caffe.ConvolutionParameter)
}